

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O1

void __thiscall Order_compond_Test::~Order_compond_Test(Order_compond_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Order, compond)
{
    auto const a = symbol("a");
    auto const x = symbol("x");
    auto const n2 = 2_i;
    auto const n3 = 3_i;
    EXPECT_EQ(toString(a*(x^n2)), "(* a (^ x 2))");
    EXPECT_EQ(toString(x^n3), "(^ x 3)");
    EXPECT_TRUE(less(a*(x^n2), x^n3));
}